

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkzb_c.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPKZB_C>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined4 extraout_XMM0_Dd;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined8 local_230;
  undefined8 local_1d8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  
  dVar6 = rho_a * rho_a;
  dVar21 = rho_b * rho_b;
  dVar7 = cbrt(rho_a);
  dVar22 = 1.0 / (dVar7 * dVar7);
  dVar8 = rho_a - rho_b;
  dVar31 = rho_a + rho_b;
  dVar23 = (1.0 / dVar31) * dVar8;
  __x = dVar23 + 1.0;
  dVar9 = cbrt(__x * 0.5);
  dVar10 = cbrt(rho_b);
  dVar24 = 1.0 / (dVar10 * dVar10);
  dVar23 = 1.0 - dVar23;
  dVar11 = cbrt(dVar23 * 0.5);
  dVar12 = cbrt(dVar31);
  dVar25 = 1.0 / dVar12;
  dVar34 = dVar25 * 2.519842099789747 * 0.9847450218426962;
  dVar38 = SQRT(dVar34);
  dVar13 = dVar38;
  if (dVar34 < 0.0) {
    dVar13 = sqrt(dVar34);
  }
  if (dVar34 < 0.0) {
    dVar38 = sqrt(dVar34);
  }
  dVar9 = __x * 0.5 * dVar9 * dVar9;
  dVar11 = dVar23 * 0.5 * dVar11 * dVar11;
  dVar14 = (dVar22 / dVar6) * sigma_aa;
  dVar38 = dVar38 * dVar38 * dVar38;
  dVar26 = 1.0 / (dVar12 * dVar12);
  dVar15 = dVar26 * 1.5874010519681996;
  dVar27 = dVar15 * 0.9697227580439723;
  dVar16 = log(16.081979498692537 /
               (dVar27 * 0.123235 + dVar38 * 0.204775 + dVar13 * 3.79785 + dVar34 * 0.8969) + 1.0);
  dVar31 = dVar31 * dVar31;
  local_230 = cbrt(1e-15);
  dVar17 = local_230 * 1e-15;
  dVar18 = cbrt(__x);
  dVar19 = cbrt(dVar23);
  dVar20 = log(32.16395899738507 /
               (dVar27 * 0.1562925 + dVar38 * 0.420775 + dVar13 * 7.05945 + dVar34 * 1.549425) + 1.0
              );
  dVar38 = log(29.608749977793437 /
               (dVar27 * 0.1241775 + dVar38 * 0.1100325 + dVar13 * 5.1785 + dVar34 * 0.905775) + 1.0
              );
  dVar27 = local_230 * local_230;
  dVar39 = sigma_ab + sigma_ab + sigma_aa + sigma_bb;
  dVar40 = dVar27 * 0.5 + 0.7937005259840998;
  dVar35 = dVar40 * dVar40;
  auVar36._8_8_ = 0x3ff0000000000000;
  auVar36._0_8_ = dVar24;
  auVar37._8_8_ = dVar35;
  auVar37._0_8_ = dVar21;
  auVar37 = divpd(auVar36,auVar37);
  dVar42 = sigma_bb * auVar37._0_8_;
  dVar43 = auVar37._8_8_ * 2.080083823051904;
  uVar4 = -(ulong)(__x <= 1e-15);
  uVar5 = -(ulong)(dVar23 <= 1e-15);
  dVar13 = dVar17;
  if ((uVar5 & 1) == 0) {
    dVar13 = dVar23 * dVar19;
  }
  dVar41 = dVar17 + 2.5198420997897464;
  dVar38 = (dVar34 * 0.0278125 + 1.0) * dVar38;
  bVar3 = (uVar4 & 1) == 0;
  if (bVar3) {
    dVar17 = __x * dVar18;
  }
  dVar44 = (dVar22 / rho_a) * tau_a * dVar9 + (dVar24 / rho_b) * tau_b * dVar11;
  dVar22 = dVar9 * dVar14 + dVar11 * dVar42;
  local_230 = 1.0 / local_230;
  dVar9 = dVar25 * 1.2599210498948732 * 2.4814019635975995;
  dVar13 = (dVar17 + dVar13 + -2.0) * 1.9236610509315362;
  dVar11 = dVar38 * dVar13 * 0.0197516734986138;
  dVar16 = dVar16 * (dVar34 * 0.053425 + 1.0) * 0.0621814;
  dVar24 = dVar8 * dVar8 * dVar8 * dVar8 * (1.0 / (dVar31 * dVar31)) *
           (dVar38 * -0.0197516734986138 + (dVar34 * 0.05137 + 1.0) * -0.0310907 * dVar20 + dVar16)
           * dVar13;
  dVar38 = (double)(~uVar5 & (ulong)(dVar19 * dVar19) | (ulong)dVar27 & uVar5) * 0.5 +
           (double)(~uVar4 & (ulong)(dVar18 * dVar18) | (ulong)dVar27 & uVar4) * 0.5;
  dVar8 = dVar38 * dVar38;
  dVar13 = local_230;
  if (bVar3) {
    dVar13 = 1.0 / dVar18;
  }
  dVar17 = (dVar41 + -2.0) * 1.9236610509315362;
  dVar34 = exp(((dVar24 - dVar16) + dVar11) * -3.258891353270929 *
               (1.0 / (dVar38 * dVar8)) * 9.869604401089358);
  dVar34 = (1.0 / (dVar34 + -1.0)) * 3.258891353270929;
  dVar25 = dVar39 * dVar39 * (dVar26 / (dVar31 * dVar31)) * dVar34 * 0.0002143700905903487 *
           (1.0 / (dVar8 * dVar8)) * 1.5874010519681996 * 7.795554179441513 +
           ((dVar25 / dVar31) * dVar39 * 1.2599210498948732 *
           (1.0 / dVar8) * 2.080083823051904 * 2.3248947030192535) / 96.0;
  dVar31 = log(dVar25 * 3.258891353270929 * 0.6585449182935511 *
               (1.0 / (dVar34 * 0.6585449182935511 * dVar25 + 1.0)) + 1.0);
  dVar18 = dVar9 * dVar13;
  dVar34 = SQRT(dVar18);
  dVar25 = dVar34;
  if (dVar18 < 0.0) {
    dVar25 = sqrt(dVar18);
  }
  dVar20 = (1.0 / (dVar40 * dVar35)) * 9.869604401089358;
  dVar15 = dVar15 * 1.5393389262365056;
  dVar26 = 1.0 / (dVar35 * dVar35);
  dVar27 = dVar12 * dVar12 * 2.519842099789747;
  if (dVar18 < 0.0) {
    dVar34 = sqrt(dVar18);
  }
  dVar34 = dVar34 * dVar34 * dVar34;
  dVar28 = dVar15 * dVar13 * dVar13;
  dVar39 = log(16.081979498692537 /
               (dVar28 * 0.123235 + dVar34 * 0.204775 + dVar25 * 3.79785 + dVar18 * 0.8969) + 1.0);
  dVar39 = (dVar18 * 0.053425 + 1.0) * 0.0621814 * dVar39;
  dVar41 = log(32.16395899738507 /
               (dVar28 * 0.1562925 + dVar34 * 0.420775 + dVar25 * 7.05945 + dVar18 * 1.549425) + 1.0
              );
  dVar25 = log(29.608749977793437 /
               (dVar28 * 0.1241775 + dVar34 * 0.1100325 + dVar25 * 5.1785 + dVar18 * 0.905775) + 1.0
              );
  dVar25 = dVar25 * (dVar18 * 0.0278125 + 1.0);
  dVar34 = dVar17 * 0.0197516734986138 * dVar25;
  dVar18 = (dVar25 * -0.0197516734986138 + (dVar18 * 0.05137 + 1.0) * -0.0310907 * dVar41 + dVar39)
           * dVar17;
  dVar25 = exp(((dVar18 - dVar39) + dVar34) * -3.258891353270929 * dVar20);
  auVar30._8_8_ = dVar25 + -1.0;
  auVar30._0_8_ = rho_a * dVar6 * dVar6;
  auVar32._8_8_ = 0x3ff0000000000000;
  auVar32._0_8_ = 1.0 / dVar7;
  auVar37 = divpd(auVar32,auVar30);
  dVar7 = auVar37._8_8_ * 3.258891353270929;
  dVar13 = sigma_aa * sigma_aa * auVar37._0_8_ * dVar7 * dVar26 * 0.0002143700905903487 *
           (1.0 / (dVar13 * dVar13)) * dVar27 * 3.0936677262801373 +
           ((1.0 / dVar13) * dVar12 * 2.3248947030192535 * dVar14 * dVar43) / 96.0;
  dVar13 = log(dVar13 * 3.258891353270929 * 0.6585449182935511 *
               (1.0 / (dVar7 * 0.6585449182935511 * dVar13 + 1.0)) + 1.0);
  local_1d8 = (double)CONCAT44((int)((ulong)dVar34 >> 0x20),extraout_XMM0_Dd);
  if ((uVar5 & 1) == 0) {
    local_230 = 1.0 / dVar19;
  }
  auVar2._8_8_ = dVar21;
  auVar2._0_8_ = dVar6;
  auVar37 = divpd(_DAT_01041040,auVar2);
  dVar9 = dVar9 * local_230;
  dVar7 = SQRT(dVar9);
  dVar6 = dVar7;
  if (dVar9 < 0.0) {
    dVar6 = sqrt(dVar9);
  }
  dVar25 = dVar40 * dVar35 * 0.031090690869654897;
  auVar1._8_8_ = tau_b * tau_b;
  auVar1._0_8_ = tau_a * tau_a;
  auVar36 = divpd(_DAT_01041040,auVar1);
  if (dVar9 < 0.0) {
    dVar7 = sqrt(dVar9);
  }
  dVar7 = dVar7 * dVar7 * dVar7;
  dVar15 = dVar15 * local_230 * local_230;
  dVar34 = log(16.081979498692537 /
               (dVar15 * 0.123235 + dVar7 * 0.204775 + dVar6 * 3.79785 + dVar9 * 0.8969) + 1.0);
  dVar34 = (dVar9 * 0.053425 + 1.0) * 0.0621814 * dVar34;
  dVar14 = log(32.16395899738507 /
               (dVar15 * 0.1562925 + dVar7 * 0.420775 + dVar6 * 7.05945 + dVar9 * 1.549425) + 1.0);
  dVar6 = log(29.608749977793437 /
              (dVar15 * 0.1241775 + dVar7 * 0.1100325 + dVar6 * 5.1785 + dVar9 * 0.905775) + 1.0);
  dVar6 = dVar6 * (dVar9 * 0.0278125 + 1.0);
  dVar7 = dVar17 * 0.0197516734986138 * dVar6;
  dVar17 = dVar17 * (dVar6 * -0.0197516734986138 +
                    (dVar9 * 0.05137 + 1.0) * -0.0310907 * dVar14 + dVar34);
  dVar6 = exp(dVar20 * ((dVar17 - dVar34) + dVar7) * -3.258891353270929);
  auVar33._8_8_ = dVar6 + -1.0;
  auVar33._0_8_ = dVar21 * dVar21 * rho_b;
  auVar29._8_8_ = 0x3ff0000000000000;
  auVar29._0_8_ = 1.0 / dVar10;
  auVar30 = divpd(auVar29,auVar33);
  dVar6 = auVar30._8_8_ * 3.258891353270929;
  dVar9 = dVar26 * sigma_bb * sigma_bb * auVar30._0_8_ * dVar6 * 0.0002143700905903487 *
          dVar27 * (1.0 / (local_230 * local_230)) * 3.0936677262801373 +
          (dVar12 * 2.3248947030192535 * (1.0 / local_230) * dVar42 * dVar43) / 96.0;
  dVar6 = log(dVar9 * 3.258891353270929 * 0.6585449182935511 *
              (1.0 / (dVar6 * 0.6585449182935511 * dVar9 + 1.0)) + 1.0);
  local_d8 = auVar36._0_8_;
  uStack_d0 = auVar36._8_8_;
  *eps = ((dVar22 * dVar22 * 0.00828125 * (1.0 / (dVar44 * dVar44)) + 1.0) *
          ((dVar11 + dVar38 * dVar8 * 0.031090690869654897 * dVar31 + dVar24) - dVar16) -
         auVar37._0_8_ * sigma_aa * sigma_aa * 0.02390625 *
         local_d8 *
         (double)(~-(ulong)(rho_a <= 1e-13 || __x <= 1e-15) &
                 (ulong)((double)(uVar4 & 0x3cd203af9ee75616 | ~uVar4 & (ulong)__x) *
                         (local_1d8 + dVar18 + (dVar13 * dVar25 - dVar39)) * 0.5))) -
         auVar37._8_8_ * sigma_bb * sigma_bb * 0.02390625 *
         uStack_d0 *
         (double)(~-(ulong)(rho_b <= 1e-13 || dVar23 <= 1e-15) &
                 (ulong)((double)(uVar5 & 0x3cd203af9ee75616 | ~uVar5 & (ulong)dVar23) *
                         (dVar7 + dVar17 + (dVar6 * dVar25 - dVar34)) * 0.5));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    (void)(lapl_a);
    (void)(lapl_b);
    (void)(eps);
    constexpr double t46 = constants::m_cbrt_3;
    constexpr double t48 = constants::m_cbrt_one_ov_pi;
    constexpr double t50 = constants::m_cbrt_4;
    constexpr double t95 = constants::m_cbrt_2;
    constexpr double t133 = constants::m_pi_sq;
    constexpr double t49 = t46 * t48;
    constexpr double t51 = t50 * t50;
    constexpr double t63 = t46 * t46;
    constexpr double t64 = t48 * t48;
    constexpr double t65 = t63 * t64;
    constexpr double t134 = 0.1e1 / t133;
    constexpr double t153 = 0.1e1 / t48;
    constexpr double t154 = t153 * t50;
    constexpr double t173 = t95 * t95;
    constexpr double t177 = 0.1e1 / t64;
    constexpr double t178 = t46 * t177;
    constexpr double t179 = t178 * t51;
    constexpr double t204 = t49 * t51;
    constexpr double t218 = t65 * t50;


    const double t2 = rho_a * rho_a;
    const double t3 = safe_math::cbrt( rho_a );
    const double t4 = t3 * t3;
    const double t6 = 0.1e1 / t4 / t2;
    const double t7 = sigma_aa * t6;
    const double t8 = rho_a - rho_b;
    const double t9 = rho_a + rho_b;
    const double t10 = 0.1e1 / t9;
    const double t11 = t8 * t10;
    const double t12 = 0.1e1 + t11;
    const double t13 = t12 / 0.2e1;
    const double t14 = safe_math::cbrt( t13 );
    const double t15 = t14 * t14;
    const double t16 = t15 * t13;
    const double t18 = rho_b * rho_b;
    const double t19 = safe_math::cbrt( rho_b );
    const double t20 = t19 * t19;
    const double t22 = 0.1e1 / t20 / t18;
    const double t23 = sigma_bb * t22;
    const double t24 = 0.1e1 - t11;
    const double t25 = t24 / 0.2e1;
    const double t26 = safe_math::cbrt( t25 );
    const double t27 = t26 * t26;
    const double t28 = t27 * t25;
    const double t30 = t16 * t7 + t23 * t28;
    const double t31 = t30 * t30;
    const double t33 = 0.1e1 / t4 / rho_a;
    const double t34 = tau_a * t33;
    const double t37 = 0.1e1 / t20 / rho_b;
    const double t38 = tau_b * t37;
    const double t40 = t16 * t34 + t28 * t38;
    const double t41 = t40 * t40;
    const double t42 = 0.1e1 / t41;
    const double t45 = 0.1e1 + 0.828125e-2 * t31 * t42;
    const double t52 = safe_math::cbrt( t9 );
    const double t53 = 0.1e1 / t52;
    const double t54 = t51 * t53;
    const double t55 = t49 * t54;
    const double t57 = 0.1e1 + 0.53425e-1 * t55;
    const double t58 = safe_math::sqrt( t55 );
    const double t61 = pow_3_2( t55 );
    const double t66 = t52 * t52;
    const double t67 = 0.1e1 / t66;
    const double t68 = t50 * t67;
    const double t69 = t65 * t68;
    const double t71 = 0.379785e1 * t58 + 0.8969e0 * t55 + 0.204775e0 * t61 + 0.123235e0 * t69;
    const double t74 = 0.1e1 + 0.16081979498692535067e2 / t71;
    const double t75 = safe_math::log( t74 );
    const double t77 = 0.621814e-1 * t57 * t75;
    const double t78 = t8 * t8;
    const double t79 = t78 * t78;
    const double t80 = t9 * t9;
    const double t81 = t80 * t80;
    const double t82 = 0.1e1 / t81;
    const double t83 = t79 * t82;
    const double t84 = t12 <= zeta_tol;
    const double t85 = safe_math::cbrt( zeta_tol );
    const double t86 = t85 * zeta_tol;
    const double t87 = safe_math::cbrt( t12 );
    const double t88 = t87 * t12;
    const double t89 = piecewise_functor_3( t84, t86, t88 );
    const double t90 = t24 <= zeta_tol;
    const double t91 = safe_math::cbrt( t24 );
    const double t92 = t91 * t24;
    const double t93 = piecewise_functor_3( t90, t86, t92 );
    const double t94 = t89 + t93 - 0.2e1;
    const double t98 = 0.1e1 / ( 0.2e1 * t95 - 0.2e1 );
    const double t99 = t94 * t98;
    const double t101 = 0.1e1 + 0.5137e-1 * t55;
    const double t106 = 0.705945e1 * t58 + 0.1549425e1 * t55 + 0.420775e0 * t61 + 0.1562925e0 * t69;
    const double t109 = 0.1e1 + 0.32163958997385070134e2 / t106;
    const double t110 = safe_math::log( t109 );
    const double t114 = 0.1e1 + 0.278125e-1 * t55;
    const double t119 = 0.51785e1 * t58 + 0.905775e0 * t55 + 0.1100325e0 * t61 + 0.1241775e0 * t69;
    const double t122 = 0.1e1 + 0.29608749977793437516e2 / t119;
    const double t123 = safe_math::log( t122 );
    const double t124 = t114 * t123;
    const double t126 = -0.310907e-1 * t101 * t110 + t77 - 0.19751673498613801407e-1 * t124;
    const double t127 = t99 * t126;
    const double t128 = t83 * t127;
    const double t130 = 0.19751673498613801407e-1 * t99 * t124;
    const double t131 = safe_math::log( 0.2e1 );
    const double t132 = 0.1e1 - t131;
    const double t135 = t132 * t134;
    const double t136 = t85 * t85;
    const double t137 = t87 * t87;
    const double t138 = piecewise_functor_3( t84, t136, t137 );
    const double t139 = t91 * t91;
    const double t140 = piecewise_functor_3( t90, t136, t139 );
    const double t142 = t138 / 0.2e1 + t140 / 0.2e1;
    const double t143 = t142 * t142;
    const double t144 = t143 * t142;
    const double t146 = sigma_aa + 0.2e1 * sigma_ab + sigma_bb;
    const double t148 = 0.1e1 / t52 / t80;
    const double t149 = t146 * t148;
    const double t151 = 0.1e1 / t143;
    const double t155 = t151 * t63 * t154;
    const double t158 = 0.1e1 / t132;
    const double t160 = ( -t77 + t128 + t130 ) * t158;
    const double t161 = 0.1e1 / t144;
    const double t162 = t133 * t161;
    const double t164 = safe_math::exp( -t160 * t162 );
    const double t165 = t164 - 0.1e1;
    const double t166 = 0.1e1 / t165;
    const double t167 = t158 * t166;
    const double t168 = t146 * t146;
    const double t170 = 0.1e1 / t66 / t81;
    const double t171 = t168 * t170;
    const double t174 = t143 * t143;
    const double t175 = 0.1e1 / t174;
    const double t176 = t173 * t175;
    const double t180 = t176 * t179;
    const double t183 = t149 * t95 * t155 / 0.96e2 + 0.21437009059034868486e-3 * t167 * t171 * t180;
    const double t184 = t183 * t158;
    const double t187 = 0.1e1 + 0.65854491829355115987e0 * t167 * t183;
    const double t188 = 0.1e1 / t187;
    const double t191 = 0.1e1 + 0.65854491829355115987e0 * t184 * t188;
    const double t192 = safe_math::log( t191 );
    const double t195 = t135 * t144 * t192 + t128 + t130 - t77;
    const double t196 = t45 * t195;
    const double t197 = sigma_aa * sigma_aa;
    const double t198 = 0.1e1 / t2;
    const double t199 = t197 * t198;
    const double t200 = tau_a * tau_a;
    const double t201 = 0.1e1 / t200;
    const double t203 = rho_a <= dens_tol || t84;
    const double t205 = t53 * t95;
    const double t206 = 0.1e1 / t85;
    const double t207 = 0.1e1 / t87;
    const double t208 = piecewise_functor_3( t84, t206, t207 );
    const double t210 = t204 * t205 * t208;
    const double t212 = 0.1e1 + 0.53425e-1 * t210;
    const double t213 = safe_math::sqrt( t210 );
    const double t216 = pow_3_2( t210 );
    const double t219 = t67 * t173;
    const double t220 = t208 * t208;
    const double t222 = t218 * t219 * t220;
    const double t224 = 0.379785e1 * t213 + 0.8969e0 * t210 + 0.204775e0 * t216 + 0.123235e0 * t222;
    const double t227 = 0.1e1 + 0.16081979498692535067e2 / t224;
    const double t228 = safe_math::log( t227 );
    const double t230 = 0.621814e-1 * t212 * t228;
    const double t231 = 0.2e1 <= zeta_tol;
    const double t233 = piecewise_functor_3( t231, t86, 0.2e1 * t95 );
    const double t234 = 0.e0 <= zeta_tol;
    const double t235 = piecewise_functor_3( t234, t86, 0.0 );
    const double t237 = ( t233 + t235 - 0.2e1 ) * t98;
    const double t239 = 0.1e1 + 0.5137e-1 * t210;
    const double t244 = 0.705945e1 * t213 + 0.1549425e1 * t210 + 0.420775e0 * t216 + 0.1562925e0 * t222;
    const double t247 = 0.1e1 + 0.32163958997385070134e2 / t244;
    const double t248 = safe_math::log( t247 );
    const double t252 = 0.1e1 + 0.278125e-1 * t210;
    const double t257 = 0.51785e1 * t213 + 0.905775e0 * t210 + 0.1100325e0 * t216 + 0.1241775e0 * t222;
    const double t260 = 0.1e1 + 0.29608749977793437516e2 / t257;
    const double t261 = safe_math::log( t260 );
    const double t262 = t252 * t261;
    const double t265 = t237 * ( -0.310907e-1 * t239 * t248 + t230 - 0.19751673498613801407e-1 * t262 );
    const double t267 = 0.19751673498613801407e-1 * t237 * t262;
    const double t268 = piecewise_functor_3( t231, t136, t173 );
    const double t269 = piecewise_functor_3( t234, t136, 0.0 );
    const double t271 = t268 / 0.2e1 + t269 / 0.2e1;
    const double t272 = t271 * t271;
    const double t273 = t272 * t271;
    const double t274 = 0.1e1 / t272;
    const double t275 = t274 * t63;
    const double t276 = t7 * t275;
    const double t277 = 0.1e1 / t208;
    const double t279 = t154 * t52 * t277;
    const double t284 = 0.1e1 / t273;
    const double t285 = t133 * t284;
    const double t287 = safe_math::exp( -( -t230 + t265 + t267 ) * t158 * t285 );
    const double t288 = t287 - 0.1e1;
    const double t289 = 0.1e1 / t288;
    const double t290 = t158 * t289;
    const double t291 = t2 * t2;
    const double t292 = t291 * rho_a;
    const double t294 = 0.1e1 / t3 / t292;
    const double t295 = t197 * t294;
    const double t296 = t272 * t272;
    const double t297 = 0.1e1 / t296;
    const double t299 = t290 * t295 * t297;
    const double t300 = t51 * t66;
    const double t301 = 0.1e1 / t220;
    const double t302 = t300 * t301;
    const double t303 = t178 * t302;
    const double t306 = t276 * t279 / 0.96e2 + 0.21437009059034868486e-3 * t299 * t303;
    const double t307 = t306 * t158;
    const double t310 = 0.1e1 + 0.65854491829355115987e0 * t290 * t306;
    const double t311 = 0.1e1 / t310;
    const double t314 = 0.1e1 + 0.65854491829355115987e0 * t307 * t311;
    const double t315 = safe_math::log( t314 );
    const double t318 = t135 * t273 * t315 - t230 + t265 + t267;
    const double t319 = piecewise_functor_3( t84, zeta_tol, t12 );
    const double t322 = piecewise_functor_3( t203, 0.0, t318 * t319 / 0.2e1 );
    const double t323 = t201 * t322;
    const double t325 = 0.2390625e-1 * t199 * t323;
    const double t326 = sigma_bb * sigma_bb;
    const double t327 = 0.1e1 / t18;
    const double t328 = t326 * t327;
    const double t329 = tau_b * tau_b;
    const double t330 = 0.1e1 / t329;
    const double t332 = rho_b <= dens_tol || t90;
    const double t333 = 0.1e1 / t91;
    const double t334 = piecewise_functor_3( t90, t206, t333 );
    const double t336 = t204 * t205 * t334;
    const double t338 = 0.1e1 + 0.53425e-1 * t336;
    const double t339 = safe_math::sqrt( t336 );
    const double t342 = pow_3_2( t336 );
    const double t344 = t334 * t334;
    const double t346 = t218 * t219 * t344;
    const double t348 = 0.379785e1 * t339 + 0.8969e0 * t336 + 0.204775e0 * t342 + 0.123235e0 * t346;
    const double t351 = 0.1e1 + 0.16081979498692535067e2 / t348;
    const double t352 = safe_math::log( t351 );
    const double t354 = 0.621814e-1 * t338 * t352;
    const double t356 = 0.1e1 + 0.5137e-1 * t336;
    const double t361 = 0.705945e1 * t339 + 0.1549425e1 * t336 + 0.420775e0 * t342 + 0.1562925e0 * t346;
    const double t364 = 0.1e1 + 0.32163958997385070134e2 / t361;
    const double t365 = safe_math::log( t364 );
    const double t369 = 0.1e1 + 0.278125e-1 * t336;
    const double t374 = 0.51785e1 * t339 + 0.905775e0 * t336 + 0.1100325e0 * t342 + 0.1241775e0 * t346;
    const double t377 = 0.1e1 + 0.29608749977793437516e2 / t374;
    const double t378 = safe_math::log( t377 );
    const double t379 = t369 * t378;
    const double t382 = t237 * ( -0.310907e-1 * t356 * t365 + t354 - 0.19751673498613801407e-1 * t379 );
    const double t384 = 0.19751673498613801407e-1 * t237 * t379;
    const double t385 = t23 * t275;
    const double t386 = 0.1e1 / t334;
    const double t388 = t154 * t52 * t386;
    const double t394 = safe_math::exp( -( -t354 + t382 + t384 ) * t158 * t285 );
    const double t395 = t394 - 0.1e1;
    const double t396 = 0.1e1 / t395;
    const double t397 = t158 * t396;
    const double t398 = t18 * t18;
    const double t399 = t398 * rho_b;
    const double t401 = 0.1e1 / t19 / t399;
    const double t402 = t326 * t401;
    const double t404 = t397 * t402 * t297;
    const double t405 = 0.1e1 / t344;
    const double t406 = t300 * t405;
    const double t407 = t178 * t406;
    const double t410 = t385 * t388 / 0.96e2 + 0.21437009059034868486e-3 * t404 * t407;
    const double t411 = t410 * t158;
    const double t414 = 0.1e1 + 0.65854491829355115987e0 * t397 * t410;
    const double t415 = 0.1e1 / t414;
    const double t418 = 0.1e1 + 0.65854491829355115987e0 * t411 * t415;
    const double t419 = safe_math::log( t418 );
    const double t422 = t135 * t273 * t419 - t354 + t382 + t384;
    const double t423 = piecewise_functor_3( t90, zeta_tol, t24 );
    const double t426 = piecewise_functor_3( t332, 0.0, t422 * t423 / 0.2e1 );
    const double t427 = t330 * t426;
    const double t429 = 0.2390625e-1 * t328 * t427;


    eps = t196 - t325 - t429;

  }